

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_l3_full.c
# Opt level: O0

int picnic_l3_full_sk_to_pk(picnic_l3_full_privatekey_t *sk,picnic_l3_full_publickey_t *pk)

{
  long in_RSI;
  long in_RDI;
  mzd_local_t ciphertext [1];
  mzd_local_t privkey [1];
  mzd_local_t plaintext [1];
  uint8_t *sk_pt;
  uint8_t *pk_pt;
  uint8_t *pk_c;
  uint8_t *sk_sk;
  picnic_instance_t *instance;
  mzd_local_t *in_stack_ffffffffffffff30;
  mzd_local_t *in_stack_ffffffffffffff38;
  lowmc_key_t *in_stack_ffffffffffffff40;
  lowmc_parameters_t *in_stack_ffffffffffffff48;
  mzd_local_t *in_stack_ffffffffffffff50;
  mzd_local_t *in_stack_ffffffffffffff58;
  undefined4 local_34;
  
  if ((in_RDI == 0) || (in_RSI == 0)) {
    local_34 = -1;
  }
  else {
    picnic_instance_get(Picnic_L3_full);
    mzd_from_char_array(in_stack_ffffffffffffff58,(uint8_t *)in_stack_ffffffffffffff50,
                        (size_t)in_stack_ffffffffffffff48);
    mzd_from_char_array(in_stack_ffffffffffffff58,(uint8_t *)in_stack_ffffffffffffff50,
                        (size_t)in_stack_ffffffffffffff48);
    lowmc_compute(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                  in_stack_ffffffffffffff30);
    *(undefined8 *)(in_RSI + 0x18) = *(undefined8 *)(in_RDI + 0x30);
    *(undefined8 *)(in_RSI + 0x20) = *(undefined8 *)(in_RDI + 0x38);
    *(undefined8 *)(in_RSI + 0x28) = *(undefined8 *)(in_RDI + 0x40);
    mzd_to_char_array((uint8_t *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                      (size_t)in_stack_ffffffffffffff48);
    local_34 = 0;
  }
  return local_34;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_l3_full_sk_to_pk(const picnic_l3_full_privatekey_t* sk,
                                                    picnic_l3_full_publickey_t* pk) {
  if (!sk || !pk) {
    return -1;
  }

  const picnic_instance_t* instance = picnic_instance_get(PARAM);

  const uint8_t* sk_sk = SK_SK(sk);
  uint8_t* pk_c        = PK_C(pk);
  uint8_t* pk_pt       = PK_PT(pk);
  const uint8_t* sk_pt = SK_PT(sk);

  mzd_local_t plaintext[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];
  mzd_local_t privkey[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];
  mzd_local_t ciphertext[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];

  mzd_from_char_array(plaintext, sk_pt, LOWMC_BLOCK_SZ);
  mzd_from_char_array(privkey, sk_sk, LOWMC_BLOCK_SZ);

  // compute public key
  lowmc_compute(&instance->lowmc, privkey, plaintext, ciphertext);

  memcpy(pk_pt, sk_pt, LOWMC_BLOCK_SZ);
  mzd_to_char_array(pk_c, ciphertext, LOWMC_BLOCK_SZ);

  return 0;
}